

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

Mat * __thiscall Mat::transpose(Mat *__return_storage_ptr__,Mat *this)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  pointer p_Var4;
  undefined8 uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  undefined8 *puVar11;
  long lVar12;
  
  Mat(__return_storage_ptr__,this->c,this->r);
  uVar2 = this->r;
  uVar3 = this->c;
  lVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar3) {
    uVar7 = (ulong)uVar3;
  }
  uVar8 = 0;
  if (0 < (int)uVar2) {
    uVar8 = (ulong)uVar2;
  }
  lVar9 = 0;
  for (uVar10 = 0; uVar10 != uVar8; uVar10 = uVar10 + 1) {
    p_Var4 = (__return_storage_ptr__->val).super__Vector_base<__int128,_std::allocator<__int128>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar11 = (undefined8 *)
              ((long)(this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar6);
    for (lVar12 = 0; uVar7 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
      uVar5 = puVar11[1];
      puVar1 = (undefined8 *)((long)p_Var4 + lVar12 + lVar9);
      *puVar1 = *puVar11;
      puVar1[1] = uVar5;
      puVar11 = puVar11 + (long)(int)uVar2 * 2;
    }
    lVar9 = lVar9 + (long)(int)uVar3 * 0x10;
    lVar6 = lVar6 + 0x10;
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::transpose() const {
    Mat ret(c, r);
    for (int i = 0; i < r; i++) {
        for (int j = 0; j < c; j++) {
            ret.val[i * c + j] = val[j * r + i];
        }
    }
    return ret;
}